

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

result<unsigned_long> * __thiscall
sockpp::socket::recv_from
          (result<unsigned_long> *__return_storage_ptr__,socket *this,void *buf,size_t n,int flags,
          sock_address *srcAddr)

{
  int iVar1;
  socket_t __fd;
  undefined4 extraout_var;
  socket *this_00;
  long ret;
  socklen_t local_64;
  sockaddr *local_60;
  socklen_t local_3c;
  sockaddr *psStack_38;
  socklen_t len;
  sockaddr *p;
  sock_address *srcAddr_local;
  size_t sStack_20;
  int flags_local;
  size_t n_local;
  void *buf_local;
  socket *this_local;
  
  p = (sockaddr *)srcAddr;
  srcAddr_local._4_4_ = flags;
  sStack_20 = n;
  n_local = (size_t)buf;
  buf_local = this;
  if (srcAddr == (sock_address *)0x0) {
    local_60 = (sockaddr *)0x0;
  }
  else {
    iVar1 = (*srcAddr->_vptr_sock_address[3])();
    local_60 = (sockaddr *)CONCAT44(extraout_var,iVar1);
  }
  psStack_38 = local_60;
  if (p == (sockaddr *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = (**(code **)(*(long *)p + 0x10))();
  }
  local_3c = local_64;
  __fd = handle(this);
  this_00 = (socket *)
            recvfrom(__fd,(void *)n_local,sStack_20,srcAddr_local._4_4_,psStack_38,&local_3c);
  check_res<long,unsigned_long>(__return_storage_ptr__,this_00,ret);
  return __return_storage_ptr__;
}

Assistant:

result<size_t>
socket::recv_from(void* buf, size_t n, int flags, sock_address* srcAddr /*=nullptr*/) {
    sockaddr* p = srcAddr ? srcAddr->sockaddr_ptr() : nullptr;
    socklen_t len = srcAddr ? srcAddr->size() : 0;

    // TODO: Check returned length

#if defined(_WIN32)
    return check_res<ssize_t, size_t>(
        ::recvfrom(handle(), reinterpret_cast<char*>(buf), int(n), flags, p, &len)
    );
#else
    return check_res<ssize_t, size_t>(::recvfrom(handle(), buf, n, flags, p, &len));
#endif
}